

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainingLayers.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeTrainingLayers(ConvertLayerParameters layerParameters)

{
  int index;
  int iVar1;
  string *psVar2;
  long *plVar3;
  Rep *pRVar4;
  Type *pTVar5;
  ostream *poVar6;
  LogMessage *other;
  mapped_type *pmVar7;
  long lVar8;
  void **ppvVar9;
  long lVar10;
  long in_stack_00000008;
  string input;
  int *in_stack_00000048;
  LogFinisher local_89;
  long *local_88 [2];
  long local_78 [2];
  LogMessage local_68;
  
  index = *in_stack_00000048;
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),index);
  iVar1 = *(int *)(in_stack_00000008 + 0x78);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"WARNING: Skipping training related layer \'",0x2a);
  psVar2 = (pTVar5->name_).ptr_;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' of type \'",0xb);
  psVar2 = (pTVar5->type_).ptr_;
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,(psVar2->_M_dataplus)._M_p,psVar2->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\'.",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if (((index != iVar1 + -1) && ((pTVar5->top_).super_RepeatedPtrFieldBase.current_size_ != 0)) &&
     ((pTVar5->bottom_).super_RepeatedPtrFieldBase.current_size_ != 0)) {
    if ((pTVar5->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_89,other);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    plVar3 = (long *)((pTVar5->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0];
    lVar10 = *plVar3;
    local_88[0] = local_78;
    std::__cxx11::string::_M_construct<char*>((string *)local_88,lVar10,plVar3[1] + lVar10);
    pRVar4 = (pTVar5->top_).super_RepeatedPtrFieldBase.rep_;
    ppvVar9 = pRVar4->elements;
    if (pRVar4 == (Rep *)0x0) {
      ppvVar9 = (void **)0x0;
    }
    lVar10 = (long)(pTVar5->top_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar10 != 0) {
      lVar8 = 0;
      do {
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)input.field_2._8_8_,*(key_type **)((long)ppvVar9 + lVar8));
        std::__cxx11::string::_M_assign((string *)pmVar7);
        lVar8 = lVar8 + 8;
      } while (lVar10 * 8 != lVar8);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
  }
  return;
}

Assistant:

void CoreMLConverter::convertCaffeTrainingLayers(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int numberOfLayers = layerParameters.prototxt.layer_size();
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    
    std::cout<< "WARNING: Skipping training related layer '" << caffeLayer.name() << "' of type '"
    << caffeLayer.type() << "'." << std::endl;
    
    if (layerId != numberOfLayers-1){
        if (caffeLayer.top_size() != 0 && caffeLayer.bottom_size() != 0) {
            std::string input = caffeLayer.bottom(0);
            for (const auto& output: caffeLayer.top()){
                mappingDataBlobNames[output] = input;
            }
        }
    }
}